

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  uint uVar1;
  TValue *local_38;
  Table *local_28;
  Table *mt;
  TMS event_local;
  TValue *o_local;
  lua_State *L_local;
  
  uVar1 = o->tt_ & 0xf;
  if (uVar1 == 5) {
    local_28 = *(Table **)((o->value_).f + 0x28);
  }
  else if (uVar1 == 7) {
    local_28 = *(Table **)((o->value_).f + 0x10);
  }
  else {
    local_28 = L->l_G->mt[(int)(o->tt_ & 0xf)];
  }
  if (local_28 == (Table *)0x0) {
    local_38 = &luaO_nilobject_;
  }
  else {
    local_38 = luaH_getshortstr(local_28,L->l_G->tmname[event]);
  }
  return local_38;
}

Assistant:

const TValue *luaT_gettmbyobj (lua_State *L, const TValue *o, TMS event) {
  Table *mt;
  switch (ttnov(o)) {
    case LUA_TTABLE:
      mt = hvalue(o)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(o)->metatable;
      break;
    default:
      mt = G(L)->mt[ttnov(o)];
  }
  return (mt ? luaH_getshortstr(mt, G(L)->tmname[event]) : luaO_nilobject);
}